

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O2

void __thiscall
rsg::EqualityComparisonOp<false>::evaluate
          (EqualityComparisonOp<false> *this,ExecValueAccess dst,ExecConstValueAccess a,
          ExecConstValueAccess b)

{
  bool bVar1;
  Type TVar2;
  int iVar3;
  VariableType *pVVar4;
  Scalar *pSVar5;
  int elemNdx;
  int iVar6;
  int compNdx;
  long lVar7;
  bool bVar8;
  ConstStridedValueAccess<64> CVar9;
  ConstStridedValueAccess<64> local_48;
  float local_34;
  
  local_48.m_value = a.m_value;
  pVVar4 = a.m_type;
  pSVar5 = dst.super_ConstStridedValueAccess<64>.m_value;
  TVar2 = pVVar4->m_baseType;
  local_48.m_type = pVVar4;
  if (TVar2 == TYPE_FLOAT) {
    for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
      bVar8 = false;
      for (iVar6 = 0; iVar6 < pVVar4->m_numElements; iVar6 = iVar6 + 1) {
        CVar9 = ConstStridedValueAccess<64>::component(&local_48,iVar6);
        local_34 = CVar9.m_value[lVar7].floatVal;
        CVar9 = ConstStridedValueAccess<64>::component(&b,iVar6);
        bVar8 = (bool)(bVar8 | local_34 != CVar9.m_value[lVar7].floatVal);
        pVVar4 = local_48.m_type;
      }
      pSVar5[lVar7].boolVal = bVar8;
    }
  }
  else if (TVar2 == TYPE_INT) {
    for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
      bVar8 = false;
      for (iVar6 = 0; iVar6 < pVVar4->m_numElements; iVar6 = iVar6 + 1) {
        CVar9 = ConstStridedValueAccess<64>::component(&local_48,iVar6);
        iVar3 = CVar9.m_value[lVar7].intVal;
        CVar9 = ConstStridedValueAccess<64>::component(&b,iVar6);
        bVar8 = (bool)(bVar8 | iVar3 != CVar9.m_value[lVar7].intVal);
        pVVar4 = local_48.m_type;
      }
      pSVar5[lVar7].boolVal = bVar8;
    }
  }
  else if (TVar2 == TYPE_BOOL) {
    for (lVar7 = 0; lVar7 != 0x40; lVar7 = lVar7 + 1) {
      bVar8 = false;
      for (iVar6 = 0; iVar6 < pVVar4->m_numElements; iVar6 = iVar6 + 1) {
        CVar9 = ConstStridedValueAccess<64>::component(&local_48,iVar6);
        bVar1 = CVar9.m_value[lVar7].boolVal;
        CVar9 = ConstStridedValueAccess<64>::component(&b,iVar6);
        bVar8 = (bool)(bVar8 | bVar1 != CVar9.m_value[lVar7].boolVal);
        pVVar4 = local_48.m_type;
      }
      pSVar5[lVar7].boolVal = bVar8;
    }
  }
  return;
}

Assistant:

void EqualityComparisonOp<IsEqual>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(a.getType() == b.getType());


	switch (a.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asFloat(compNdx), b.component(elemNdx).asFloat(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		case VariableType::TYPE_INT:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asInt(compNdx), b.component(elemNdx).asInt(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		case VariableType::TYPE_BOOL:
			for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
			{
				bool result = IsEqual ? true : false;

				for (int elemNdx = 0; elemNdx < a.getType().getNumElements(); elemNdx++)
					result = EqualityCompare<IsEqual>::combine(result, EqualityCompare<IsEqual>::compare(a.component(elemNdx).asBool(compNdx), b.component(elemNdx).asBool(compNdx)));

				dst.asBool(compNdx) = result;
			}
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}